

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O2

int testNumberOfNeighborsWithDefaultValueOutOfRange(void)

{
  bool bVar1;
  KNearestNeighborsClassifier *this;
  Int64Parameter *this_00;
  Int64Range *pIVar2;
  NearestNeighborsIndex *this_01;
  SingleKdTreeIndex *pSVar3;
  ostream *poVar4;
  Model m1;
  Result res;
  
  CoreML::Specification::Model::Model(&m1);
  CoreML::KNNValidatorTests::generateInterface(&m1);
  this = CoreML::Specification::Model::_internal_mutable_knearestneighborsclassifier(&m1);
  this_00 = CoreML::Specification::KNearestNeighborsClassifier::_internal_mutable_numberofneighbors
                      (this);
  pIVar2 = CoreML::Specification::Int64Parameter::_internal_mutable_range(this_00);
  pIVar2->minvalue_ = 1;
  pIVar2 = CoreML::Specification::Int64Parameter::_internal_mutable_range(this_00);
  pIVar2->maxvalue_ = 10;
  this_00->defaultvalue_ = 0xf;
  CoreML::Specification::KNearestNeighborsClassifier::_internal_mutable_uniformweighting(this);
  this_01 = CoreML::Specification::KNearestNeighborsClassifier::
            _internal_mutable_nearestneighborsindex(this);
  CoreML::Specification::NearestNeighborsIndex::_internal_mutable_squaredeuclideandistance(this_01);
  pSVar3 = CoreML::Specification::NearestNeighborsIndex::_internal_mutable_singlekdtreeindex
                     (this_01);
  pSVar3->leafsize_ = 0x1e;
  CoreML::Specification::KNearestNeighborsClassifier::set_defaultstringlabel<char_const(&)[8]>
            (this,(char (*) [8])"Default");
  CoreML::validate<(MLModelType)404>(&res,&m1);
  bVar1 = CoreML::Result::good(&res);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x1e3);
    poVar4 = std::operator<<(poVar4,": error: ");
    poVar4 = std::operator<<(poVar4,"!((res).good())");
    poVar4 = std::operator<<(poVar4," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m1);
  return (uint)bVar1;
}

Assistant:

int testNumberOfNeighborsWithDefaultValueOutOfRange() {

    Specification::Model m1;

    KNNValidatorTests::generateInterface(m1);

    auto *knnClassifier = m1.mutable_knearestneighborsclassifier();
    auto *numberOfNeighbors = knnClassifier->mutable_numberofneighbors();
    numberOfNeighbors->mutable_range()->set_minvalue(1);
    numberOfNeighbors->mutable_range()->set_maxvalue(10);
    numberOfNeighbors->set_defaultvalue(15);

    knnClassifier->mutable_uniformweighting();

    auto *nnIndex = knnClassifier->mutable_nearestneighborsindex();
    nnIndex->mutable_squaredeuclideandistance();
    auto *kdTree = nnIndex->mutable_singlekdtreeindex();
    kdTree->set_leafsize(30);
    knnClassifier->set_defaultstringlabel("Default");

    // Validation should fail since numberOfNeighbors defaultValue is out of range bounds.
    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    return 0;

}